

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::objectivec::ObjCClassDeclaration_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,string_view class_name)

{
  AlphaNum local_98;
  AlphaNum local_68;
  undefined8 local_38;
  char *local_30;
  
  local_68.piece_._M_str = (char *)class_name._M_len;
  local_38 = 0x18;
  local_30 = "GPBObjCClassDeclaration(";
  local_98.piece_._M_len = 2;
  local_98.piece_._M_str = ");";
  local_68.piece_._M_len = (size_t)this;
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_38,&local_68,&local_98,&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string ObjCClassDeclaration(absl::string_view class_name) {
  return absl::StrCat("GPBObjCClassDeclaration(", class_name, ");");
}